

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O3

NFADepartureSet<unsigned_char> * __thiscall
Centaurus::NFADepartureSetFactory<unsigned_char>::build_departure_set
          (NFADepartureSet<unsigned_char> *__return_storage_ptr__,
          NFADepartureSetFactory<unsigned_char> *this)

{
  _Rb_tree_header *__position;
  _Base_ptr p_Var1;
  Range<unsigned_char> *mr;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_node_base *p_Var3;
  pointer pRVar4;
  _Base_ptr p_Var5;
  NFATransition<unsigned_char> *tr;
  pointer pNVar6;
  pointer pNVar7;
  Range<unsigned_char> atomic_range;
  IndexVector borders_for_one_tr;
  set<int,_std::less<int>,_std::allocator<int>_> borders;
  Range<unsigned_char> local_b0;
  int local_9c;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_98;
  NFADepartureSetFactory<unsigned_char> *local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  __position = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pNVar7 = (this->m_transitions).
           super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pNVar6 = (this->m_transitions).
           super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_68 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &__position->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &__position->_M_header;
  if (pNVar6 == pNVar7) {
    (__return_storage_ptr__->
    super_vector<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
    ).
    super__Vector_base<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
    ).
    super__Vector_base<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
    ).
    super__Vector_base<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    __return_storage_ptr__->_vptr_NFADepartureSet = (_func_int **)&PTR__NFADepartureSet_001a6e60;
  }
  else {
    do {
      CharClass<unsigned_char>::collect_borders((IndexVector *)&local_98,&pNVar6->m_label);
      p_Var1 = local_98._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var5 = (_Base_ptr)
               CONCAT44(local_98._M_impl.super__Rb_tree_header._M_header._4_4_,
                        local_98._M_impl.super__Rb_tree_header._M_header._M_color);
      local_b0._vptr_Range = (_func_int **)&local_60;
      if (p_Var5 != local_98._M_impl.super__Rb_tree_header._M_header._M_parent) {
        do {
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique_<int_const&,std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::_Alloc_node>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &local_60,(const_iterator)__position,(int *)p_Var5,(_Alloc_node *)&local_b0);
          p_Var5 = (_Base_ptr)&p_Var5->field_0x4;
        } while (p_Var5 != p_Var1);
        p_Var5 = (_Base_ptr)
                 CONCAT44(local_98._M_impl.super__Rb_tree_header._M_header._4_4_,
                          local_98._M_impl.super__Rb_tree_header._M_header._M_color);
      }
      if (p_Var5 != (_Base_ptr)0x0) {
        operator_delete(p_Var5);
      }
      p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      pNVar6 = pNVar6 + 1;
    } while (pNVar6 != pNVar7);
    (__return_storage_ptr__->
    super_vector<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
    ).
    super__Vector_base<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
    ).
    super__Vector_base<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
    ).
    super__Vector_base<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__->_vptr_NFADepartureSet = (_func_int **)&PTR__NFADepartureSet_001a6e60;
    if (((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != __position)
       && (p_Var2 = (_Rb_tree_node_base *)
                    std::_Rb_tree_increment
                              (local_60._M_impl.super__Rb_tree_header._M_header._M_left),
          (_Rb_tree_header *)p_Var2 != __position)) {
      do {
        p_Var3 = p_Var2;
        local_b0.m_start = (uchar)p_Var5[1]._M_color;
        local_b0.m_end = (uchar)p_Var3[1]._M_color;
        local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_b0._vptr_Range = (_func_int **)&PTR__Range_001a6578;
        local_98._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_98._M_impl.super__Rb_tree_header._M_header;
        local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
        pNVar7 = (local_68->m_transitions).
                 super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pNVar6 = (local_68->m_transitions).
                 super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_98._M_impl.super__Rb_tree_header._M_header._M_right =
             local_98._M_impl.super__Rb_tree_header._M_header._M_left;
        if (pNVar7 != pNVar6) {
          do {
            for (pRVar4 = (pNVar7->m_label).m_ranges.
                          super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pRVar4 != (pNVar7->m_label).m_ranges.
                          super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish; pRVar4 = pRVar4 + 1) {
              if ((pRVar4->m_start <= local_b0.m_start) && (local_b0.m_end <= pRVar4->m_end)) {
                local_9c = pNVar7->m_dest;
                std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                _M_insert_unique<int>(&local_98,&local_9c);
                break;
              }
            }
            pNVar7 = pNVar7 + 1;
          } while (pNVar7 != pNVar6);
          if (local_98._M_impl.super__Rb_tree_header._M_node_count != 0) {
            NFADepartureSet<unsigned_char>::add
                      (__return_storage_ptr__,&local_b0,(NFAClosure *)&local_98);
          }
        }
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&local_98);
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
        p_Var5 = p_Var3;
      } while ((_Rb_tree_header *)p_Var2 != __position);
    }
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return __return_storage_ptr__;
}

Assistant:

bool run(const std::basic_string<TCHAR>& seq, int index = 0, int input_pos = 0) const
    {
        if (index == m_states.size() - 1 && seq.size() == input_pos)
        {
            return true;
        }
        else
        {
            for (const auto& tr : get_transitions(index))
            {
                if (tr.is_epsilon())
                {
                    if (run(seq, tr.dest(), input_pos))
                        return true;
                }
                else if (tr.label().includes(seq[input_pos]))
                {
                    if (run(seq, tr.dest(), input_pos + 1))
                        return true;
                }
            }
            return false;
        }
    }